

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool P_TestMobjZ(AActor *actor,bool quick,AActor **pOnmobj)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  AActor *pAVar5;
  bool bVar6;
  char cVar7;
  AActor *pAVar8;
  AActor *pAVar9;
  CheckResult cres;
  FPortalGroupArray check;
  FMultiBlockThingsIterator it;
  int local_228;
  int local_224;
  CheckResult local_220;
  FPortalGroupArray local_1f8;
  FMultiBlockThingsIterator local_1d0;
  
  if (((actor->flags).Value & 0x1000) == 0) {
    local_1f8.data.Array = (unsigned_short *)0x0;
    local_1f8.data.Most = 0;
    local_1f8.data.Count = 0;
    local_1f8.method = 1;
    local_1f8.varused = '\0';
    local_1f8.inited = false;
    FMultiBlockThingsIterator::FMultiBlockThingsIterator(&local_1d0,&local_1f8,actor,-1.0,true);
    pAVar9 = (AActor *)0x0;
    do {
      bVar6 = FMultiBlockThingsIterator::Next(&local_1d0,&local_220);
      pAVar5 = local_220.thing;
      if (!bVar6) break;
      dVar3 = (local_220.thing)->radius + actor->radius;
      if (((dVar3 <= ABS(((local_220.thing)->__Pos).X - local_220.Position.X)) ||
          (dVar3 <= ABS(((local_220.thing)->__Pos).Y - local_220.Position.Y))) ||
         ((((actor->flags2).Value | ((local_220.thing)->flags2).Value) >> 0x14 & 1) != 0)) {
LAB_0050f57d:
        pAVar5 = pAVar9;
        cVar7 = '\0';
      }
      else {
        if (((actor->flags6).Value & 2) != 0) {
          (*((local_220.thing)->super_DThinker).super_DObject._vptr_DObject[0x21])
                    (&local_224,local_220.thing);
          (*(actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_228,actor);
          if (local_224 == local_228) goto LAB_0050f57d;
        }
        uVar2 = (pAVar5->flags).Value;
        if (((uVar2 & 0x1003) != 2) ||
           (((uVar2 >> 0x14 & 1) != 0 && (-1 < (int)(actor->flags).Value)))) goto LAB_0050f57d;
        if (((pAVar5->flags4).Value & 0x80) == 0) {
          if ((pAVar5 != actor) && (((actor->flags).Value & 1) == 0)) goto LAB_0050f502;
          goto LAB_0050f57d;
        }
        if (pAVar5 == actor) goto LAB_0050f57d;
LAB_0050f502:
        if (((actor->flags).Value & 0x10000) != 0) {
          pAVar8 = (actor->target).field_0.p;
          if ((pAVar8 != (AActor *)0x0) &&
             (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (actor->target).field_0.p = (AActor *)0x0;
            pAVar8 = (AActor *)0x0;
          }
          if (pAVar5 == pAVar8) goto LAB_0050f57d;
        }
        dVar3 = (actor->__Pos).Z;
        dVar1 = (pAVar5->__Pos).Z;
        dVar4 = pAVar5->Height + dVar1;
        if (((dVar4 < dVar3) || (dVar3 + actor->Height <= dVar1)) ||
           ((cVar7 = quick, pAVar9 != (AActor *)0x0 && !quick &&
            (dVar4 < (pAVar9->__Pos).Z + pAVar9->Height)))) goto LAB_0050f57d;
      }
      pAVar9 = pAVar5;
    } while (cVar7 == '\0');
    if (pOnmobj != (AActor **)0x0) {
      *pOnmobj = pAVar9;
    }
    bVar6 = pAVar9 == (AActor *)0x0;
    TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
              (&local_1d0.blockIterator.DynHash);
    TArray<unsigned_short,_unsigned_short>::~TArray(&local_1f8.data);
  }
  else {
    bVar6 = true;
    if (pOnmobj != (AActor **)0x0) {
      *pOnmobj = (AActor *)0x0;
    }
  }
  return bVar6;
}

Assistant:

bool P_TestMobjZ(AActor *actor, bool quick, AActor **pOnmobj)
{
	AActor *onmobj = NULL;
	if (actor->flags & MF_NOCLIP)
	{
		if (pOnmobj) *pOnmobj = NULL;
		return true;
	}

	FPortalGroupArray check;
	FMultiBlockThingsIterator it(check, actor, -1, true);
	FMultiBlockThingsIterator::CheckResult cres;

	while (it.Next(&cres))
	{
		AActor *thing = cres.thing;

		double blockdist = thing->radius + actor->radius;
		if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		{
			continue;
		}
		if ((actor->flags2 | thing->flags2) & MF2_THRUACTORS)
		{
			continue;
		}
		if ((actor->flags6 & MF6_THRUSPECIES) && (thing->GetSpecies() == actor->GetSpecies()))
		{
			continue;
		}
		if (!(thing->flags & MF_SOLID))
		{ // Can't hit thing
			continue;
		}
		if (thing->flags & (MF_SPECIAL | MF_NOCLIP))
		{ // [RH] Specials and noclippers don't block moves
			continue;
		}
		if (thing->flags & (MF_CORPSE))
		{ // Corpses need a few more checks
			if (!(actor->flags & MF_ICECORPSE))
				continue;
		}
		if (!(thing->flags4 & MF4_ACTLIKEBRIDGE) && (actor->flags & MF_SPECIAL))
		{ // [RH] Only bridges block pickup items
			continue;
		}
		if (thing == actor)
		{ // Don't clip against self
			continue;
		}
		if ((actor->flags & MF_MISSILE) && (thing == actor->target))
		{ // Don't clip against whoever shot the missile.
			continue;
		}
		if (actor->Z() > thing->Top())
		{ // over thing
			continue;
		}
		else if (actor->Top() <= thing->Z())
		{ // under thing
			continue;
		}
		else if (!quick && onmobj != NULL && thing->Top() < onmobj->Top())
		{ // something higher is in the way
			continue;
		}
		onmobj = thing;
		if (quick) break;
	}

	if (pOnmobj) *pOnmobj = onmobj;
	return onmobj == NULL;
}